

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O0

void __thiscall FileInputSource::unreadCh(FileInputSource *this,char ch)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char local_11;
  FileInputSource *pFStack_10;
  char ch_local;
  FileInputSource *this_local;
  
  local_11 = ch;
  pFStack_10 = this;
  iVar1 = ungetc((uint)(byte)ch,(FILE *)this->file);
  if (iVar1 == -1) {
    std::operator+(&local_38,&this->filename,": unread character");
    QUtil::throw_system_error(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void
FileInputSource::unreadCh(char ch)
{
    if (ungetc(static_cast<unsigned char>(ch), this->file) == -1) {
        QUtil::throw_system_error(this->filename + ": unread character");
    }
}